

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

uint32_t nni_msg_trim_u32(nni_msg *m)

{
  uint uVar1;
  
  if ((m->m_body).ch_len < 4) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message.c",
              0x13f,"ch->ch_len >= sizeof(v)");
  }
  uVar1 = *(uint *)(m->m_body).ch_ptr;
  nni_chunk_trim(&m->m_body,4);
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

uint32_t
nni_msg_trim_u32(nni_msg *m)
{
	return (nni_chunk_trim_u32(&m->m_body));
}